

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O0

VkLogicOp __thiscall
Diligent::LogicOperationToVkLogicOp::operator[](LogicOperationToVkLogicOp *this,LOGIC_OPERATION op)

{
  Char *Message;
  const_reference pvVar1;
  char (*in_RCX) [53];
  undefined1 local_38 [8];
  string msg;
  LOGIC_OPERATION op_local;
  LogicOperationToVkLogicOp *this_local;
  
  msg.field_2._M_local_buf[0xf] = op;
  if (((char)op < '\0') || ('\x0f' < (char)op)) {
    FormatString<char[26],char[53]>
              ((string *)local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"op >= LOGIC_OP_CLEAR && op < LOGIC_OP_NUM_OPERATIONS",in_RCX);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"operator[]",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
               ,0x37b);
    std::__cxx11::string::~string((string *)local_38);
  }
  pvVar1 = std::array<VkLogicOp,_16UL>::operator[]
                     (&this->m_Map,(long)(int)msg.field_2._M_local_buf[0xf]);
  return *pvVar1;
}

Assistant:

VkLogicOp operator[](LOGIC_OPERATION op) const
    {
        VERIFY_EXPR(op >= LOGIC_OP_CLEAR && op < LOGIC_OP_NUM_OPERATIONS);
        return m_Map[static_cast<int>(op)];
    }